

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O1

void __thiscall
kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[41]>
          (Fault *this,char *file,int line,Type code,char *condition,char *macroArgs,
          DebugExpression<bool> *params,char (*params_1) [41])

{
  long lVar1;
  undefined8 uVar2;
  undefined8 *puVar3;
  char (*params_00) [41];
  long lVar4;
  String argValues [2];
  String *pSVar5;
  undefined8 uVar6;
  String local_78;
  String local_60;
  String *local_40;
  undefined8 uStack_38;
  
  this->exception = (Exception *)0x0;
  heapString(&local_78,5);
  if ((char *)local_78.content.size_ != (char *)0x0) {
    local_78.content.size_ = (size_t)local_78.content.ptr;
  }
  builtin_strncpy((char *)local_78.content.size_,"false",5);
  str<char_const(&)[41]>(&local_60,(kj *)params_1,params_00);
  pSVar5 = &local_78;
  uStack_38 = 2;
  uVar6 = 2;
  local_40 = pSVar5;
  init(this,(EVP_PKEY_CTX *)file);
  lVar4 = 0x18;
  do {
    lVar1 = *(long *)((long)&local_78.content.ptr + lVar4);
    if (lVar1 != 0) {
      uVar2 = *(undefined8 *)((long)&local_78.content.size_ + lVar4);
      *(undefined8 *)((long)&local_78.content.ptr + lVar4) = 0;
      *(undefined8 *)((long)&local_78.content.size_ + lVar4) = 0;
      puVar3 = *(undefined8 **)((long)&local_78.content.disposer + lVar4);
      (**(code **)*puVar3)(puVar3,lVar1,1,uVar2,uVar2,0,pSVar5,uVar6);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != -0x18);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}